

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

void __thiscall
Js::JavascriptStackWalker::SetCachedInternalFrameInfo
          (JavascriptStackWalker *this,InternalFrameType frameType,JavascriptFunction *function,
          bool hasInlinedFramesOnStack,bool previousInterpreterFrameIsFromBailout)

{
  void *codeAddress;
  void *framePointer;
  size_t stackCheckCodeHeight;
  bool previousInterpreterFrameIsFromBailout_local;
  bool hasInlinedFramesOnStack_local;
  JavascriptFunction *function_local;
  InternalFrameType frameType_local;
  JavascriptStackWalker *this_local;
  
  if ((this->lastInternalFrameInfo).codeAddress == (void *)0x0) {
    codeAddress = GetCurrentCodeAddr(this);
    framePointer = Amd64StackFrame::GetFrame(&this->currentFrame);
    stackCheckCodeHeight = Amd64StackFrame::GetStackCheckCodeHeight(&this->currentFrame);
    InternalFrameInfo::Set
              (&this->lastInternalFrameInfo,codeAddress,framePointer,stackCheckCodeHeight,frameType,
               function,hasInlinedFramesOnStack,previousInterpreterFrameIsFromBailout);
  }
  return;
}

Assistant:

void JavascriptStackWalker::SetCachedInternalFrameInfo(InternalFrameType frameType, JavascriptFunction* function, bool hasInlinedFramesOnStack, bool previousInterpreterFrameIsFromBailout)
    {
        if (!this->lastInternalFrameInfo.codeAddress)
        {
            this->lastInternalFrameInfo.Set(
                this->GetCurrentCodeAddr(),
                this->currentFrame.GetFrame(),
                this->currentFrame.GetStackCheckCodeHeight(),
                frameType,
                function,
                hasInlinedFramesOnStack,
                previousInterpreterFrameIsFromBailout);
        }
    }